

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O0

void lexWord(char **cur,char *end,SmallVectorImpl<char> *unescapedWord)

{
  bool bVar1;
  char local_2d;
  char local_2c;
  char local_2b [3];
  int local_28;
  int local_24;
  int c_1;
  int c;
  SmallVectorImpl<char> *unescapedWord_local;
  char *end_local;
  char **cur_local;
  
  _c_1 = unescapedWord;
  unescapedWord_local = (SmallVectorImpl<char> *)end;
  end_local = (char *)cur;
  do {
    if (*(SmallVectorImpl<char> **)end_local == unescapedWord_local) {
      return;
    }
    local_24 = (int)**(char **)end_local;
    if (local_24 == 0x5c) {
      if (((SmallVectorImpl<char> *)(*(long *)end_local + 1) != unescapedWord_local) &&
         (*(char *)(*(long *)end_local + 1) == '\n')) {
        return;
      }
      *(long *)end_local = *(long *)end_local + 1;
      local_28 = (int)**(char **)end_local;
      if (((local_28 == 0x20) || (local_28 == 0x23)) || (local_28 == 0x5c)) {
        local_2b[2] = **(char **)end_local;
        llvm::SmallVectorTemplateBase<char,_true>::push_back
                  (&_c_1->super_SmallVectorTemplateBase<char,_true>,local_2b + 2);
      }
      else {
        local_2b[1] = 0x5c;
        llvm::SmallVectorTemplateBase<char,_true>::push_back
                  (&_c_1->super_SmallVectorTemplateBase<char,_true>,local_2b + 1);
        local_2b[0] = (char)local_28;
        llvm::SmallVectorTemplateBase<char,_true>::push_back
                  (&_c_1->super_SmallVectorTemplateBase<char,_true>,local_2b);
      }
    }
    else if (((local_24 == 0x24) &&
             ((SmallVectorImpl<char> *)(*(long *)end_local + 1) != unescapedWord_local)) &&
            (*(char *)(*(long *)end_local + 1) == '$')) {
      local_2c = **(char **)end_local;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&_c_1->super_SmallVectorTemplateBase<char,_true>,&local_2c);
      *(long *)end_local = *(long *)end_local + 1;
    }
    else {
      bVar1 = isWordChar(local_24);
      if (!bVar1) {
        return;
      }
      local_2d = (char)local_24;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&_c_1->super_SmallVectorTemplateBase<char,_true>,&local_2d);
    }
    *(long *)end_local = *(long *)end_local + 1;
  } while( true );
}

Assistant:

static void lexWord(const char*& cur, const char* end,
                    SmallVectorImpl<char> &unescapedWord) {
  for (; cur != end; ++cur) {
    int c = *cur;

    // Check if this is an escape sequence.
    if (c == '\\') {
      // If this is a line continuation, it ends the word.
      if (cur + 1 != end && cur[1] == '\n')
        break;

      // Otherwise, skip the escaped character.
      ++cur;
      int c = *cur;

      // Honor the escaping rules as generated by Clang and GCC, which are *not
      // necessarily* the actual escaping rules of BSD Make or GNU Make. Due to
      // incompatibilities in the escape syntax between those two makes, and the
      // GNU make behavior of retrying an escaped string with the original
      // input, GCC/Clang adopt a strategy around escaping ' ' and '#', but not
      // r"\\" itself, or any other characters. However, there are some
      // situations where Clang *will* generate an escaped '\\' using the
      // r"\\\\" sequence, so we also honor that.
      //
      // FIXME: Make this more complete, or move to a better dependency format.
      if (c == ' ' || c == '#' || c == '\\') {
        unescapedWord.push_back(c);
      } else {
        unescapedWord.push_back('\\');
        unescapedWord.push_back(c);
      }
      continue;
    } else if (c == '$' && cur + 1 != end && cur[1] == '$') {
      // "$$" is an escaped '$'.
      unescapedWord.push_back(c);
      ++cur;
      continue;
    }

    // Otherwise, if this is not a valid word character then skip it.
    if (!isWordChar(c)) {
#if defined(_WIN32)
      // If we encounter a colon and it looks like a driver letter separator, use
      // it as that instead of separating the word.
      if (c == ':' && cur + 1 != end && (*(cur + 1) == '/' || *(cur + 1) == '\\')) {
        unescapedWord.push_back(':');
        continue;
      }
#endif
      break;
    }
    unescapedWord.push_back(c);
  }
}